

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

void __thiscall Clasp::mt::ParallelHandler::clearDB(ParallelHandler *this,Solver *s)

{
  pointer ppCVar1;
  Constraint *c;
  uint32 size;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->integrated_).ebo_.size;
  if (uVar4 != 0) {
    ppCVar1 = (this->integrated_).ebo_.buf;
    lVar3 = 0;
    do {
      c = *(Constraint **)((long)ppCVar1 + lVar3);
      if (s == (Solver *)0x0) {
        (*c->_vptr_Constraint[5])(c,0,0);
      }
      else {
        size = (*c->_vptr_Constraint[0x13])(c);
        Solver::addLearnt(s,c,size,Other);
      }
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
  }
  uVar2 = 0;
  (this->integrated_).ebo_.size = 0;
  this->intEnd_ = 0;
  if (this->recEnd_ != 0) {
    do {
      SharedLiterals::release(this->received_[uVar2],1);
      uVar2 = uVar2 + 1;
    } while (uVar2 != this->recEnd_);
  }
  this->recEnd_ = 0;
  return;
}

Assistant:

void ParallelHandler::clearDB(Solver* s) {
	for (ClauseDB::iterator it = integrated_.begin(), end = integrated_.end(); it != end; ++it) {
		ClauseHead* c = static_cast<ClauseHead*>(*it);
		if (s) { s->addLearnt(c, c->size(), Constraint_t::Other); }
		else   { c->destroy(); }
	}
	integrated_.clear();
	intEnd_= 0;
	for (uint32 i = 0; i != recEnd_; ++i) { received_[i]->release(); }
	recEnd_= 0;
}